

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.h
# Opt level: O3

Literal Clasp::DecisionHeuristic::selectLiteral(Solver *s,Var v,int signScore)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  
  if (v < (s->assign_).pref_.ebo_.size) {
    bVar1 = (s->assign_).pref_.ebo_.buf[v].rep;
    if ((signScore != 0) && ((bVar1 & 0x3f) == 0)) {
LAB_0016d24b:
      return (Literal)(v << 2 | (uint)signScore >> 0x1e & 0xfffffffe);
    }
    if (bVar1 != 0) {
      bVar3 = (-bVar1 & bVar1 & 0xaa) != 0;
      goto LAB_0016d2d4;
    }
  }
  else if (signScore != 0) goto LAB_0016d24b;
  switch(SUB84(s->strategy_,4) >> 0x15 & 3) {
  case 0:
    uVar2 = 2;
    if (v < (s->shared_->varInfo_).ebo_.size) {
      uVar2 = ~(uint)(s->shared_->varInfo_).ebo_.buf[v].rep >> 2 & 2;
    }
    return (Literal)(uVar2 + v * 4);
  case 1:
    return (Literal)(v << 2);
  case 2:
    return (Literal)(v * 4 + 2);
  case 3:
    uVar2 = (s->rng).seed_ * 0x343fd + 0x269ec3;
    (s->rng).seed_ = uVar2;
    bVar3 = (double)(uVar2 >> 0x10 & 0x7fff) * 3.0517578125e-05 < 0.5;
  }
LAB_0016d2d4:
  return (Literal)(v * 4 + (uint)bVar3 * 2);
}

Assistant:

static Literal selectLiteral(const Solver& s, Var v, int signScore) {
		ValueSet prefs = s.pref(v);
		if (signScore != 0 && !prefs.has(ValueSet::user_value | ValueSet::saved_value | ValueSet::pref_value)) {
			return Literal(v, signScore < 0);
		}
		else if (!prefs.empty()) {
			return Literal(v, prefs.sign());
		}
		return s.defaultLit(v);
	}